

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

void Emb_ManCollectSuper_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vSuper,Vec_Int_t *vVisit)

{
  Gia_Obj_t *pGVar1;
  uint uVar2;
  
  while( true ) {
    if ((*(ulong *)pObj & 0x4000000000000000) != 0) {
      return;
    }
    *(ulong *)pObj = *(ulong *)pObj | 0x4000000000000000;
    pGVar1 = p->pObjs;
    if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) break;
    Vec_IntPush(vVisit,(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555);
    uVar2 = (uint)*(ulong *)pObj;
    if ((uVar2 >> 0x1e & 1) != 0) {
      pGVar1 = p->pObjs;
      if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
        Vec_IntPush(vSuper,(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555);
        return;
      }
      break;
    }
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEmbed.c"
                    ,0x127,
                    "void Emb_ManCollectSuper_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    Emb_ManCollectSuper_rec(p,pObj + -(ulong)(uVar2 & 0x1fffffff),vSuper,vVisit);
    pObj = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Emb_ManCollectSuper_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vSuper, Vec_Int_t * vVisit )  
{
    if ( pObj->fMark1 )
        return;
    pObj->fMark1 = 1;
    Vec_IntPush( vVisit, Gia_ObjId(p, pObj) );
    if ( pObj->fMark0 )
    {
        Vec_IntPush( vSuper, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Emb_ManCollectSuper_rec( p, Gia_ObjFanin0(pObj), vSuper, vVisit );
    Emb_ManCollectSuper_rec( p, Gia_ObjFanin1(pObj), vSuper, vVisit );
    
}